

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.cpp
# Opt level: O1

int __thiscall
jbcoin::verify(jbcoin *this,STObject *st,HashPrefix *prefix,PublicKey *pk,SF_Blob *sigField)

{
  int iVar1;
  Serializer ss;
  optional<jbcoin::Slice> sig;
  Serializer local_70;
  optional<jbcoin::Slice> local_58;
  pointer local_40;
  long local_38;
  type local_30;
  undefined8 uStack_28;
  
  get<jbcoin::Slice,jbcoin::STBlob>(&local_58,this,(STObject *)pk,(TypedField<jbcoin::STBlob> *)pk);
  if (local_58.super_type.m_initialized == true) {
    Serializer::Serializer(&local_70,0x100);
    Serializer::add32(&local_70,*(uint32_t *)&(st->super_STBase)._vptr_STBase);
    STObject::add((STObject *)this,&local_70,false);
    local_38 = (long)local_70.mData.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_70.mData.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_40 = local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (local_58.super_type.m_initialized == false) {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                    "pointer_const_type boost::optional<jbcoin::Slice>::operator->() const [T = jbcoin::Slice]"
                   );
    }
    local_30 = local_58.super_type.m_storage.dummy_.aligner_;
    uStack_28 = local_58.super_type.m_storage.dummy_._8_8_;
    iVar1 = verify((EVP_PKEY_CTX *)prefix,(uchar *)&local_40,(size_t)&local_30,(uchar *)0x1,
                   (size_t)sigField);
    if (local_70.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.mData.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.mData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.mData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

bool
verify (STObject const& st, HashPrefix const& prefix,
    PublicKey const& pk, SF_Blob const& sigField)
{
    auto const sig = get(st, sigField);
    if (! sig)
        return false;
    Serializer ss;
    ss.add32(prefix);
    st.addWithoutSigningFields(ss);
    return verify(pk,
        Slice(ss.data(), ss.size()),
            Slice(sig->data(), sig->size()));
}